

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

token * __thiscall libchars::commands::find_pval(commands *this,token *position)

{
  token **pptVar1;
  token *ptVar2;
  
  if (this->cmd != (command *)0x0) {
    pptVar1 = &position->next;
    if (position == (token *)0x0) {
      pptVar1 = &this->t_par;
    }
    for (ptVar2 = *pptVar1; (ptVar2 != (token *)0x0 && (ptVar2->ttype != VALUE));
        ptVar2 = ptVar2->next) {
    }
    return ptVar2;
  }
  return (token *)0x0;
}

Assistant:

token *commands::find_pval(token *position)
    {
        if (cmd == NULL)
            return NULL;

        token *T = (position == NULL) ? t_par : position->next;
        while (T != NULL && T->ttype != token::VALUE)
            T = T->next;

        return T;
    }